

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O0

tuple<int,_int> __thiscall
Display::getRequiredWindowSize(Display *this,int field_width,int field_height,int mine_count)

{
  __tuple_element_t<1UL,_tuple<int,_int>_> *p_Var1;
  undefined1 local_50 [16];
  int text_height;
  int max_text_width;
  undefined1 local_2c [16];
  int required_height;
  int required_width;
  int mine_count_local;
  int field_height_local;
  int field_width_local;
  
  local_2c._8_4_ = field_height;
  local_2c._12_4_ = field_width;
  required_height = mine_count;
  required_width = field_height;
  mine_count_local = field_width;
  _field_height_local = this;
  getConsolePosition((Display *)local_2c,field_width + -1,field_height + -1);
  std::tie<int,int>(&text_height,(int *)(local_2c + 0xc));
  std::tuple<int&,int&>::operator=((tuple<int&,int&> *)&text_height,(tuple<int,_int> *)local_2c);
  local_50._12_4_ = getMaxTextWidth(required_height);
  getConsolePosition((Display *)local_50,mine_count_local + -1,required_width + 2);
  p_Var1 = std::get<1ul,int,int>((tuple<int,_int> *)local_50);
  local_50._8_4_ = *p_Var1;
  if ((int)local_2c._12_4_ < (int)local_50._12_4_) {
    local_2c._12_4_ = local_50._12_4_;
  }
  if ((int)local_2c._8_4_ < (int)local_50._8_4_) {
    local_2c._8_4_ = local_50._8_4_;
  }
  local_2c._12_4_ = local_2c._12_4_ + 1;
  local_2c._8_4_ = local_2c._8_4_ + 1;
  std::make_tuple<int&,int&>((int *)this,(int *)(local_2c + 0xc));
  return (tuple<int,_int>)(_Tuple_impl<0UL,_int,_int>)this;
}

Assistant:

std::tuple<int, int> Display::getRequiredWindowSize(int field_width, int field_height, int mine_count) {
    int required_width = field_width;
    int required_height = field_height;

    std::tie(required_width, required_height) = getConsolePosition(field_width - 1, field_height - 1);

    int max_text_width = getMaxTextWidth(mine_count);

    int text_height;
    text_height = std::get<1>(getConsolePosition(field_width - 1, field_height + 2));

    if (max_text_width > required_width) {
        required_width = max_text_width;
    }

    if (text_height > required_height) {
        required_height = text_height;
    }

    // the output until now are coordinates to write
    // convert to amount of cols/rows
    required_width++;
    required_height++;

    return std::make_tuple(required_width, required_height);
}